

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

handle pybind11::detail::list_caster<std::vector<int,std::allocator<int>>,int>::
       cast<std::vector<int,std::allocator<int>>>
                 (vector<int,_std::allocator<int>_> *src,return_value_policy policy,handle parent)

{
  int *piVar1;
  handle hVar2;
  PyObject *pPVar3;
  handle hVar4;
  long lVar5;
  int *piVar6;
  PyObject *tmp;
  list l;
  object value_;
  handle local_40;
  handle local_38;
  
  list::list((list *)&local_40,
             (long)(src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  piVar6 = (src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar1 = (src->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  hVar4.m_ptr = (PyObject *)0x0;
  lVar5 = 0;
  do {
    hVar2.m_ptr = local_40.m_ptr;
    if (piVar6 == piVar1) {
      local_40.m_ptr = (PyObject *)0x0;
      hVar4.m_ptr = hVar2.m_ptr;
      break;
    }
    pPVar3 = (PyObject *)PyLong_FromSsize_t((long)*piVar6);
    local_38.m_ptr = pPVar3;
    if (pPVar3 != (PyObject *)0x0) {
      local_38.m_ptr = (PyObject *)0x0;
      if (((local_40.m_ptr)->ob_type->tp_flags & 0x2000000) == 0) {
        __assert_fail("PyList_Check(l.ptr())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/vrunge[P]slopeOP/pybind11/include/pybind11/stl.h"
                      ,0xb2,
                      "static handle pybind11::detail::list_caster<std::vector<int>, int>::cast(T &&, return_value_policy, handle) [Type = std::vector<int>, Value = int, T = std::vector<int>]"
                     );
      }
      (&((local_40.m_ptr[1].ob_type)->ob_base).ob_base.ob_refcnt)[lVar5] = (Py_ssize_t)pPVar3;
      lVar5 = lVar5 + 1;
    }
    object::~object((object *)&local_38);
    piVar6 = piVar6 + 1;
  } while (pPVar3 != (PyObject *)0x0);
  object::~object((object *)&local_40);
  return (handle)hVar4.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }